

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_extrude_twod(REF_GRID_conflict *extruded_grid,REF_GRID twod_grid,REF_INT n_planes)

{
  REF_NODE pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  REF_GRID_conflict pRVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  uint uVar7;
  int iVar8;
  REF_STATUS RVar9;
  int iVar10;
  undefined8 uVar11;
  long lVar12;
  REF_CELL ref_cell;
  char *pcVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  REF_GRID pRVar18;
  REF_INT max_faceid;
  REF_INT new_cell;
  int local_168;
  REF_INT faceid1;
  REF_GRID_conflict local_160;
  REF_DBL local_158;
  REF_INT new_node;
  REF_GRID local_148;
  ulong local_140;
  undefined8 local_138;
  int iStack_130;
  int iStack_12c;
  undefined8 local_128;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  ulong local_b0;
  REF_INT nodes [27];
  
  pRVar1 = twod_grid->node;
  *extruded_grid = (REF_GRID_conflict)0x0;
  if (twod_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3f9,
           "ref_grid_extrude_twod","require twod grid input");
    RVar9 = 1;
  }
  else {
    uVar7 = ref_grid_create(extruded_grid,twod_grid->mpi);
    if (uVar7 == 0) {
      local_160 = *extruded_grid;
      local_168 = n_planes + -1;
      local_138 = (double)local_168;
      uVar17 = 0;
      local_b0 = (ulong)(uint)n_planes;
      if (n_planes < 1) {
        local_b0 = uVar17;
      }
      ref_node = local_160->node;
      iVar8 = 0;
      local_148 = twod_grid;
      while (iVar8 != (int)local_b0) {
        local_140 = CONCAT44(local_140._4_4_,iVar8);
        local_158 = (double)iVar8 / local_138;
        lVar16 = 1;
        for (lVar14 = 0; lVar14 < pRVar1->max; lVar14 = lVar14 + 1) {
          if (-1 < pRVar1->global[lVar14]) {
            uVar7 = ref_node_add(ref_node,pRVar1->global[lVar14] + uVar17,&new_node);
            if (uVar7 != 0) {
              uVar17 = (ulong)uVar7;
              pcVar13 = "add node in plane";
              uVar11 = 0x405;
              goto LAB_00126da6;
            }
            ref_node->part[new_node] = pRVar1->part[lVar14];
            pRVar2 = pRVar1->real;
            pRVar3 = ref_node->real;
            lVar12 = (long)new_node;
            pRVar3[lVar12 * 0xf] = pRVar2[lVar16 + -1];
            pRVar3[lVar12 * 0xf + 1] = local_158;
            pRVar3[lVar12 * 0xf + 2] = pRVar2[lVar16];
          }
          lVar16 = lVar16 + 0xf;
        }
        uVar17 = uVar17 + pRVar1->old_n_global;
        iVar8 = (int)local_140 + 1;
      }
      uVar7 = ref_node_initialize_n_global(ref_node,uVar17);
      if (uVar7 == 0) {
        iVar15 = 0;
        iVar8 = 0;
        if (0 < local_168) {
          iVar8 = local_168;
        }
        local_158 = (REF_DBL)CONCAT44(local_158._4_4_,iVar8);
        while( true ) {
          pRVar18 = local_148;
          ref_cell = local_148->cell[0];
          iVar8 = ref_cell->max;
          if (iVar8 <= iVar15) break;
          RVar9 = ref_cell_nodes(ref_cell,iVar15,nodes);
          if (RVar9 == 0) {
            uVar7 = ref_grid_orient_edg(local_148,nodes);
            RVar5 = nodes[1];
            RVar6 = nodes[0];
            if (uVar7 != 0) {
              uVar17 = (ulong)uVar7;
              pcVar13 = "orient_edge";
              uVar11 = 0x412;
              goto LAB_00126da6;
            }
            iVar8 = 0;
            while (local_158._0_4_ != iVar8) {
              iVar10 = pRVar1->n * iVar8;
              iVar8 = iVar8 + 1;
              iStack_11c = pRVar1->n * iVar8;
              local_128 = CONCAT44(iVar10 + RVar6,iVar10 + RVar5);
              iStack_120 = iStack_11c + RVar6;
              iStack_11c = iStack_11c + RVar5;
              local_118 = nodes[2];
              uVar7 = ref_cell_add(local_160->cell[6],(REF_INT *)&local_128,&new_cell);
              if (uVar7 != 0) {
                uVar17 = (ulong)uVar7;
                pcVar13 = "boundary";
                uVar11 = 0x41e;
                goto LAB_00126da6;
              }
            }
          }
          iVar15 = iVar15 + 1;
        }
        max_faceid = -0x80000000;
        for (iVar15 = 0; iVar15 < iVar8; iVar15 = iVar15 + 1) {
          RVar9 = ref_cell_nodes(ref_cell,iVar15,nodes);
          RVar6 = max_faceid;
          if ((RVar9 == 0) && (RVar6 = nodes[2], nodes[2] < max_faceid)) {
            RVar6 = max_faceid;
          }
          max_faceid = RVar6;
          ref_cell = pRVar18->cell[0];
          iVar8 = ref_cell->max;
        }
        faceid1 = max_faceid;
        uVar7 = ref_mpi_max(pRVar18->mpi,&faceid1,&max_faceid,1);
        if (uVar7 == 0) {
          uVar7 = ref_mpi_bcast(pRVar18->mpi,&max_faceid,1,1);
          if (uVar7 == 0) {
            faceid1 = max_faceid + 1;
            local_140 = (ulong)(max_faceid + 2);
            local_138 = (double)CONCAT44(local_138._4_4_,pRVar1->n * local_168);
            for (iVar8 = 0; pRVar4 = local_160, iVar8 < pRVar18->cell[3]->max; iVar8 = iVar8 + 1) {
              RVar9 = ref_cell_nodes(pRVar18->cell[3],iVar8,nodes);
              pRVar4 = local_160;
              if (RVar9 == 0) {
                local_128 = CONCAT44(nodes[1],nodes[0]);
                iStack_120 = nodes[2];
                iStack_11c = faceid1;
                uVar7 = ref_cell_add(local_160->cell[3],(REF_INT *)&local_128,&new_cell);
                if (uVar7 != 0) {
                  uVar17 = (ulong)uVar7;
                  pcVar13 = "boundary";
                  uVar11 = 0x435;
                  goto LAB_00126da6;
                }
                local_128 = CONCAT44(nodes[2] + (int)local_138,nodes[0] + (int)local_138);
                iStack_120 = nodes[1] + (int)local_138;
                iStack_11c = (int)local_140;
                uVar7 = ref_cell_add(pRVar4->cell[3],(REF_INT *)&local_128,&new_cell);
                if (uVar7 != 0) {
                  uVar17 = (ulong)uVar7;
                  pcVar13 = "boundary";
                  uVar11 = 0x43a;
                  goto LAB_00126da6;
                }
                iVar15 = 0;
                while (local_158._0_4_ != iVar15) {
                  iStack_120 = pRVar1->n * iVar15;
                  iVar15 = iVar15 + 1;
                  local_114 = pRVar1->n * iVar15;
                  local_128 = CONCAT44(nodes[1] + iStack_120,nodes[0] + iStack_120);
                  iStack_120 = iStack_120 + nodes[2];
                  iStack_11c = nodes[0] + local_114;
                  local_118 = nodes[1] + local_114;
                  local_114 = local_114 + nodes[2];
                  uVar7 = ref_cell_add(pRVar4->cell[10],(REF_INT *)&local_128,&new_cell);
                  if (uVar7 != 0) {
                    uVar17 = (ulong)uVar7;
                    pcVar13 = "interior";
                    uVar11 = 0x445;
                    goto LAB_00126da6;
                  }
                }
              }
              pRVar18 = local_148;
            }
            iStack_130 = local_168 * pRVar1->n;
            iVar8 = 0;
            iStack_12c = iStack_130;
            local_138._0_4_ = iStack_130;
            local_138._4_4_ = iStack_130;
            do {
              if (local_148->cell[6]->max <= iVar8) {
                return 0;
              }
              RVar9 = ref_cell_nodes(local_148->cell[6],iVar8,nodes);
              if (RVar9 == 0) {
                local_128 = CONCAT44(nodes[2],nodes[1]);
                iStack_120 = nodes[1];
                iStack_11c = nodes[0];
                local_118 = faceid1;
                uVar7 = ref_cell_add(local_160->cell[6],(REF_INT *)&local_128,&new_cell);
                if (uVar7 != 0) {
                  uVar11 = 0x450;
LAB_001272ba:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,uVar11,"ref_grid_extrude_twod",(ulong)uVar7,"boundary");
                  return uVar7;
                }
                iStack_120 = nodes[2] + iStack_130;
                iStack_11c = nodes[3] + iStack_12c;
                local_128 = CONCAT44(nodes[1] + local_138._4_4_,nodes[0] + (int)local_138);
                local_118 = (int)local_140;
                uVar7 = ref_cell_add(local_160->cell[6],(REF_INT *)&local_128,&new_cell);
                if (uVar7 != 0) {
                  uVar11 = 0x456;
                  goto LAB_001272ba;
                }
                iVar15 = 0;
                while (local_158._0_4_ != iVar15) {
                  iStack_11c = pRVar1->n * iVar15;
                  iVar15 = iVar15 + 1;
                  local_10c = pRVar1->n * iVar15;
                  local_128 = CONCAT44(nodes[1] + iStack_11c,nodes[0] + iStack_11c);
                  iStack_120 = nodes[2] + iStack_11c;
                  iStack_11c = iStack_11c + nodes[3];
                  local_118 = nodes[0] + local_10c;
                  local_114 = nodes[1] + local_10c;
                  local_110 = nodes[2] + local_10c;
                  local_10c = local_10c + nodes[3];
                  uVar7 = ref_cell_add(pRVar4->cell[0xb],(REF_INT *)&local_128,&new_cell);
                  if (uVar7 != 0) {
                    uVar11 = 0x463;
                    goto LAB_001272ba;
                  }
                }
              }
              iVar8 = iVar8 + 1;
            } while( true );
          }
          uVar17 = (ulong)uVar7;
          pcVar13 = "share max faceid";
          uVar11 = 0x42b;
        }
        else {
          uVar17 = (ulong)uVar7;
          pcVar13 = "max faceid";
          uVar11 = 0x429;
        }
      }
      else {
        uVar17 = (ulong)uVar7;
        pcVar13 = "init glob";
        uVar11 = 0x40d;
      }
    }
    else {
      uVar17 = (ulong)uVar7;
      pcVar13 = "create grid";
      uVar11 = 0x3fa;
    }
LAB_00126da6:
    RVar9 = (REF_STATUS)uVar17;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar11,
           "ref_grid_extrude_twod",uVar17,pcVar13);
  }
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_grid_extrude_twod(REF_GRID *extruded_grid,
                                         REF_GRID twod_grid, REF_INT n_planes) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_NODE twod_node = ref_grid_node(twod_grid);
  REF_INT plane, node, new_node;
  REF_INT offset, offset0, offset1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_INT max_faceid, faceid1, faceid2;
  REF_GLOB global_offset;
  REF_DBL y;
  *extruded_grid = NULL;
  RAS(ref_grid_twod(twod_grid), "require twod grid input");
  RSS(ref_grid_create(extruded_grid, ref_grid_mpi(twod_grid)), "create grid");
  ref_grid = *extruded_grid;
  ref_node = ref_grid_node(ref_grid);

  global_offset = 0;
  for (plane = 0; plane < n_planes; plane++) {
    y = (REF_DBL)plane / (REF_DBL)(n_planes - 1);
    each_ref_node_valid_node(twod_node, node) {
      RSS(ref_node_add(ref_node,
                       ref_node_global(twod_node, node) + global_offset,
                       &new_node),
          "add node in plane");
      ref_node_part(ref_node, new_node) = ref_node_part(twod_node, node);
      ref_node_xyz(ref_node, 0, new_node) = ref_node_xyz(twod_node, 0, node);
      ref_node_xyz(ref_node, 1, new_node) = y;
      ref_node_xyz(ref_node, 2, new_node) = ref_node_xyz(twod_node, 1, node);
    }
    global_offset += ref_node_n_global(twod_node);
  }
  RSS(ref_node_initialize_n_global(ref_node, global_offset), "init glob");

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    REF_INT node0, node1;
    /* use triangle to orient edge correctly */
    RSS(ref_grid_orient_edg(twod_grid, nodes), "orient_edge");
    node0 = nodes[0];
    node1 = nodes[1];
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = node1 + offset0;
      new_nodes[1] = node0 + offset0;
      new_nodes[2] = node0 + offset1;
      new_nodes[3] = node1 + offset1;
      new_nodes[4] = nodes[2];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  /* find two unused faceids for the symmetry planes */
  max_faceid = REF_INT_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    max_faceid = MAX(max_faceid, nodes[2]);
  }
  faceid1 = max_faceid;
  RSS(ref_mpi_max(ref_grid_mpi(twod_grid), &faceid1, &max_faceid, REF_INT_TYPE),
      "max faceid");
  RSS(ref_mpi_bcast(ref_grid_mpi(twod_grid), &max_faceid, 1, REF_INT_TYPE),
      "share max faceid");
  faceid1 = max_faceid + 1;
  faceid2 = max_faceid + 2;

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[0];
    new_nodes[1] = nodes[1];
    new_nodes[2] = nodes[2];
    new_nodes[3] = faceid1;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[2] + offset;
    new_nodes[2] = nodes[1] + offset;
    new_nodes[3] = faceid2;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[0] + offset1;
      new_nodes[4] = nodes[1] + offset1;
      new_nodes[5] = nodes[2] + offset1;
      RSS(ref_cell_add(ref_grid_pri(ref_grid), new_nodes, &new_cell),
          "interior");
    }
  }

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[3];
    new_nodes[1] = nodes[2];
    new_nodes[2] = nodes[1];
    new_nodes[3] = nodes[0];
    new_nodes[4] = faceid1;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[1] + offset;
    new_nodes[2] = nodes[2] + offset;
    new_nodes[3] = nodes[3] + offset;
    new_nodes[4] = faceid2;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[3] + offset0;
      new_nodes[4] = nodes[0] + offset1;
      new_nodes[5] = nodes[1] + offset1;
      new_nodes[6] = nodes[2] + offset1;
      new_nodes[7] = nodes[3] + offset1;
      RSS(ref_cell_add(ref_grid_hex(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  return REF_SUCCESS;
}